

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O0

DistributionMapping amrex::DistributionMapping::makeSFC(MultiFab *weight,bool sort)

{
  int nprocs_00;
  undefined1 in_DL;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  FabArrayBase *in_RSI;
  element_type *in_RDI;
  DistributionMapping DVar1;
  int nprocs;
  Vector<long,_std::allocator<long>_> cost;
  DistributionMapping *r;
  undefined1 sort_00;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffffd0;
  BoxArray *in_stack_ffffffffffffffd8;
  DistributionMapping *in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  
  anon_unknown_22::gather_weights
            ((MultiFab *)(CONCAT17(in_DL,in_stack_ffffffffffffffe8) & 0x1ffffffffffffff));
  nprocs_00 = ParallelContext::NProcsSub();
  sort_00 = 0;
  DistributionMapping((DistributionMapping *)0xf5b789);
  FabArrayBase::boxArray(in_RSI);
  SFCProcessorMap(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                  nprocs_00,(bool)sort_00);
  Vector<long,_std::allocator<long>_>::~Vector((Vector<long,_std::allocator<long>_> *)0xf5b803);
  DVar1.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  DVar1.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (DistributionMapping)
         DVar1.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

DistributionMapping
DistributionMapping::makeSFC (const MultiFab& weight, bool sort)
{
    BL_PROFILE("makeSFC");
    Vector<Long> cost = gather_weights(weight);
    int nprocs = ParallelContext::NProcsSub();
    DistributionMapping r;
    r.SFCProcessorMap(weight.boxArray(), cost, nprocs, sort);
    return r;
}